

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathWrapExternal(void *val)

{
  xmlXPathObjectPtr ret;
  void *val_local;
  
  val_local = (*xmlMalloc)(0x48);
  if ((undefined4 *)val_local == (undefined4 *)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating user object\n");
    val_local = (void *)0x0;
  }
  else {
    memset(val_local,0,0x48);
    *(undefined4 *)val_local = 8;
    *(void **)((long)val_local + 0x28) = val;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapExternal (void *val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating user object\n");
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_USERS;
    ret->user = val;
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_USERS);
#endif
    return(ret);
}